

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

size_t __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,size_t pageToDecommit)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint index;
  uint uVar6;
  BVIndex i;
  BVIndex BVar7;
  
  if (pageToDecommit == 0) {
LAB_00709cc0:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x250,"(pageToDecommit != 0 && this->GetAvailablePageCount() > 0)",
                       "pageToDecommit != 0 && this->GetAvailablePageCount() > 0");
    if (!bVar2) goto LAB_00709e11;
    *puVar5 = 0;
  }
  else {
    uVar4 = GetAvailablePageCount(this);
    if (uVar4 == 0) goto LAB_00709cc0;
  }
  uVar6 = 0;
  index = 0;
  BVar7 = 0;
  do {
    i = BVar7;
    BVar3 = BVStatic<272UL>::Test(&this->freePages,i);
    if (BVar3 == '\0') {
      if (index < i) {
        DecommitFreePagesInternal(this,index,i - index);
      }
      index = i + 1;
    }
    else {
      uVar6 = uVar6 + 1;
    }
    BVar7 = i + 1;
    uVar4 = GetAvailablePageCount(this);
  } while ((BVar7 < uVar4) && (uVar6 < pageToDecommit));
  if (index <= i) {
    DecommitFreePagesInternal(this,index,BVar7 - index);
  }
  if (this->freePageCount < uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x26b,"(decommitCount <= this->freePageCount)",
                       "decommitCount <= this->freePageCount");
    if (!bVar2) {
LAB_00709e11:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  this->decommitPageCount = this->decommitPageCount + uVar6;
  this->freePageCount = this->freePageCount - uVar6;
  return (ulong)uVar6;
}

Assistant:

size_t
PageSegmentBase<T>::DecommitFreePages(size_t pageToDecommit)
{
    Assert(pageToDecommit != 0 && this->GetAvailablePageCount() > 0);

    uint startIndex = 0, index = 0, decommitCount = 0;
    do
    {
        if (!this->TestInFreePagesBitVector(index))
        {
            if (startIndex < index)
            {
                uint pageCount = index - startIndex;
                this->DecommitFreePagesInternal(startIndex, pageCount);
            }
            startIndex = index + 1;
        }
        else
        {
            decommitCount++;
        }
    }
    while (++index < this->GetAvailablePageCount() && decommitCount < pageToDecommit);

    if (startIndex < index)
    {
        uint pageCount = index - startIndex;
        this->DecommitFreePagesInternal(startIndex, pageCount);
    }

    Assert(decommitCount <= this->freePageCount);
    this->decommitPageCount += decommitCount;
    this->freePageCount -= decommitCount;
    return decommitCount;
}